

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

bool __thiscall QMimeData::hasUrls(QMimeData *this)

{
  byte bVar1;
  long *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  textUriListLiteral();
  bVar1 = (**(code **)(*in_RDI + 0x60))(in_RDI,local_20);
  QString::~QString((QString *)0x3e5d37);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QMimeData::hasUrls() const
{
    return hasFormat(textUriListLiteral());
}